

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstraintsGroup.cpp
# Opt level: O3

bool __thiscall
iDynTree::optimalcontrol::ConstraintsGroup::evaluateConstraints
          (ConstraintsGroup *this,double time,VectorDynSize *state,VectorDynSize *control,
          VectorDynSize *constraints)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  void *__s;
  uint uVar3;
  _Hash_node_base *p_Var4;
  element_type *peVar5;
  long *plVar6;
  undefined8 uVar7;
  bool bVar8;
  char cVar9;
  Index size;
  ulong uVar10;
  ostream *poVar11;
  size_t sVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ConstraintsGroupPimpl *pCVar17;
  long lVar18;
  ulong uVar19;
  Index size_1;
  undefined4 uVar20;
  reverse_iterator constraintIterator;
  ostringstream errorMsg;
  pointer local_1d0;
  shared_ptr<iDynTree::optimalcontrol::TimedConstraint> *local_1c8;
  shared_ptr<iDynTree::optimalcontrol::TimedConstraint> local_1b8;
  pointer local_1a8 [14];
  ios_base local_138 [264];
  
  bVar8 = isAnyTimeGroup(this);
  uVar20 = SUB84(time,0);
  if (bVar8) {
    p_Var4 = ((this->m_pimpl->group)._M_h._M_before_begin._M_nxt[5]._M_nxt)->_M_nxt;
    cVar9 = (*(code *)p_Var4->_M_nxt[3]._M_nxt)(uVar20,p_Var4,state,control,constraints);
    if (cVar9 != '\0') {
      uVar10 = iDynTree::VectorDynSize::size();
      if (uVar10 <= this->m_pimpl->maxConstraintSize) {
        return true;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Constraint named ",0x11);
      p_Var4 = (this->m_pimpl->group)._M_h._M_before_begin._M_nxt;
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,(char *)p_Var4[1]._M_nxt,(long)p_Var4[2]._M_nxt);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,"output a vector bigger than the specified size.",0x2f);
      std::__cxx11::stringbuf::str();
      iDynTree::reportError("ConstraintsGroup","evaluateConstraints",(char *)local_1c8);
LAB_00176429:
      if (local_1c8 != &local_1b8) {
        operator_delete(local_1c8,
                        (ulong)((long)&((local_1b8.
                                         super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->constraint).
                                       super___shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
LAB_00176462:
    bVar8 = false;
  }
  else {
    uVar10 = iDynTree::VectorDynSize::size();
    pCVar17 = this->m_pimpl;
    if (uVar10 < pCVar17->maxConstraintSize) {
      iDynTree::VectorDynSize::resize((ulong)constraints);
      pCVar17 = this->m_pimpl;
    }
    local_1c8 = (pCVar17->orderedIntervals).
                super__Vector_base<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_1a8[0] = (pCVar17->orderedIntervals).
                   super__Vector_base<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
    std::
    __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>*,std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>>>>>,__gnu_cxx::__ops::_Iter_pred<iDynTree::optimalcontrol::ConstraintsGroup::ConstraintsGroupPimpl::findActiveConstraint(double)::_lambda(std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>const&)_1_>>
              (uVar20,&local_1d0);
    if (local_1d0 ==
        (this->m_pimpl->orderedIntervals).
        super__Vector_base<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      iDynTree::VectorDynSize::zero();
    }
    else {
      peVar5 = local_1d0[-1].
               super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      plVar6 = *(long **)&peVar5->constraint;
      cVar9 = (**(code **)(*plVar6 + 0x18))(uVar20,plVar6,state,control,&peVar5->constraintBuffer);
      if (cVar9 == '\0') goto LAB_00176462;
      uVar10 = iDynTree::VectorDynSize::size();
      if (this->m_pimpl->maxConstraintSize < uVar10) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Constraint named ",0x11);
        p_Var4 = (this->m_pimpl->group)._M_h._M_before_begin._M_nxt;
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(char *)p_Var4[1]._M_nxt,(long)p_Var4[2]._M_nxt);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11,"output a vector bigger than the specified size.",0x2f);
        std::__cxx11::stringbuf::str();
        iDynTree::reportError("ConstraintsGroup","evaluateConstraints",(char *)local_1c8);
        goto LAB_00176429;
      }
      sVar12 = Constraint::constraintSize
                         (*(Constraint **)
                           &(local_1d0[-1].
                             super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->constraint);
      if (sVar12 < this->m_pimpl->maxConstraintSize) {
        lVar13 = iDynTree::VectorDynSize::data();
        iDynTree::VectorDynSize::size();
        uVar14 = iDynTree::VectorDynSize::data();
        iDynTree::VectorDynSize::size();
        uVar15 = iDynTree::VectorDynSize::size();
        uVar10 = uVar15;
        if (((uVar14 & 7) == 0) &&
           (uVar10 = (ulong)((uint)(uVar14 >> 3) & 1), (long)uVar15 <= (long)uVar10)) {
          uVar10 = uVar15;
        }
        lVar18 = uVar15 - uVar10;
        if (0 < (long)uVar10) {
          uVar19 = 0;
          do {
            *(undefined8 *)(uVar14 + uVar19 * 8) = *(undefined8 *)(lVar13 + uVar19 * 8);
            uVar19 = uVar19 + 1;
          } while (uVar10 != uVar19);
        }
        uVar19 = (lVar18 - (lVar18 >> 0x3f) & 0xfffffffffffffffeU) + uVar10;
        if (1 < lVar18) {
          do {
            puVar1 = (undefined8 *)(lVar13 + uVar10 * 8);
            uVar7 = puVar1[1];
            puVar2 = (undefined8 *)(uVar14 + uVar10 * 8);
            *puVar2 = *puVar1;
            puVar2[1] = uVar7;
            uVar10 = uVar10 + 2;
          } while ((long)uVar10 < (long)uVar19);
        }
        if ((long)uVar19 < (long)uVar15) {
          do {
            *(undefined8 *)(uVar14 + uVar19 * 8) = *(undefined8 *)(lVar13 + uVar19 * 8);
            uVar19 = uVar19 + 1;
          } while (uVar15 != uVar19);
        }
        lVar13 = iDynTree::VectorDynSize::data();
        lVar18 = iDynTree::VectorDynSize::size();
        uVar3 = this->m_pimpl->maxConstraintSize;
        lVar16 = iDynTree::VectorDynSize::size();
        uVar14 = (ulong)uVar3 - lVar16;
        __s = (void *)(lVar13 + (lVar18 - uVar14) * 8);
        uVar10 = uVar14;
        if ((((ulong)__s & 7) == 0) &&
           (uVar10 = (ulong)((uint)((ulong)__s >> 3) & 1), (long)uVar14 <= (long)uVar10)) {
          uVar10 = uVar14;
        }
        lVar13 = uVar14 - uVar10;
        if (0 < (long)uVar10) {
          memset(__s,0,uVar10 * 8);
        }
        lVar18 = (lVar13 - (lVar13 >> 0x3f) & 0xfffffffffffffffeU) + uVar10;
        if (1 < lVar13) {
          lVar16 = uVar10 + 2;
          if ((long)(uVar10 + 2) < lVar18) {
            lVar16 = lVar18;
          }
          memset((void *)(uVar10 * 8 + (long)__s),0,
                 (~uVar10 + lVar16 & 0xfffffffffffffffe) * 8 + 0x10);
        }
        if ((long)uVar14 <= lVar18) {
          return true;
        }
        memset((void *)((long)__s + uVar10 * 8 + (lVar13 / 2) * 0x10),0,(lVar13 % 2) * 8);
        return true;
      }
      iDynTree::VectorDynSize::operator=
                (constraints,
                 &(local_1d0[-1].
                   super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->constraintBuffer);
    }
    bVar8 = true;
  }
  return bVar8;
}

Assistant:

bool ConstraintsGroup::evaluateConstraints(double time, const VectorDynSize &state, const VectorDynSize &control, VectorDynSize &constraints)
        {
            if (isAnyTimeGroup()) {
                if (!(m_pimpl->group.begin()->second.get()->constraint->evaluateConstraint(time, state, control, constraints))) {
                    return false;
                }
                if (constraints.size() > m_pimpl->maxConstraintSize) {
                    std::ostringstream errorMsg;
                    errorMsg << "Constraint named "<<m_pimpl->group.begin()->first<< "output a vector bigger than the specified size.";
                    reportError("ConstraintsGroup", "evaluateConstraints", errorMsg.str().c_str());
                    return false;
                }
                return true;
            }

            if (constraints.size() < m_pimpl->maxConstraintSize) {
                constraints.resize(m_pimpl->maxConstraintSize);
            }

            std::vector< TimedConstraint_ptr >::reverse_iterator constraintIterator = m_pimpl->findActiveConstraint(time);
            if (constraintIterator == m_pimpl->orderedIntervals.rend()) { //it means that there are no constraints at that time, what should be the constraint value?
                constraints.zero();
                return true;
            }
            
            if(!(constraintIterator->get()->constraint->evaluateConstraint(time, state, control, constraintIterator->get()->constraintBuffer))) {
                return false;
            }

            if (constraintIterator->get()->constraintBuffer.size() > m_pimpl->maxConstraintSize) {
                std::ostringstream errorMsg;
                errorMsg << "Constraint named "<<m_pimpl->group.begin()->first<< "output a vector bigger than the specified size.";
                reportError("ConstraintsGroup", "evaluateConstraints", errorMsg.str().c_str());
                return false;
            }

            if (constraintIterator->get()->constraint->constraintSize() < m_pimpl->maxConstraintSize) {
                toEigen(constraints).segment(0,constraintIterator->get()->constraintBuffer.size()) = toEigen(constraintIterator->get()->constraintBuffer);
                toEigen(constraints).tail(m_pimpl->maxConstraintSize - constraintIterator->get()->constraintBuffer.size()).setZero(); //append 0 at the end to equate the maxConstraintSize.
            } else {
                constraints = constraintIterator->get()->constraintBuffer;
            }

            return true;
        }